

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O3

void __thiscall
testing::internal::MatchesRegexMatcher::DescribeTo(MatchesRegexMatcher *this,ostream *os)

{
  char *pcVar1;
  allocator<char> local_31;
  string local_30;
  
  pcVar1 = "contains";
  if ((ulong)this->full_match_ != 0) {
    pcVar1 = "matches";
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar1,8 - (ulong)this->full_match_);
  std::__ostream_insert<char,std::char_traits<char>>(os," regular expression ",0x14);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             (((this->regex_).
               super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             pattern_)._M_dataplus._M_p,&local_31);
  PrintStringTo(&local_30,os);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void DescribeTo(::std::ostream* os) const {
    *os << (full_match_ ? "matches" : "contains") << " regular expression ";
    UniversalPrinter<std::string>::Print(regex_->pattern(), os);
  }